

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

void __thiscall absl::lts_20250127::Cord::Prepend(Cord *this,Cord *src)

{
  bool bVar1;
  Nullable<absl::cord_internal::CordRep_*> rep;
  CordRep *tree;
  Nullable<const_char_*> pcVar2;
  size_t sVar3;
  string_view src_00;
  
  InlineRep::MaybeRemoveEmptyCrcNode(&this->contents_);
  bVar1 = empty(src);
  if (bVar1) {
    return;
  }
  rep = InlineRep::tree(&src->contents_);
  if (rep != (Nullable<absl::cord_internal::CordRep_*>)0x0) {
    LOCK();
    (rep->refcount).count_.super___atomic_base<int>._M_i =
         (rep->refcount).count_.super___atomic_base<int>._M_i + 2;
    UNLOCK();
    tree = cord_internal::RemoveCrcNode(rep);
    InlineRep::PrependTree(&this->contents_,tree,kPrependCord);
    return;
  }
  pcVar2 = InlineRep::data(&src->contents_);
  sVar3 = InlineRep::size(&src->contents_);
  src_00._M_str = pcVar2;
  src_00._M_len = sVar3;
  Prepend(this,src_00);
  return;
}

Assistant:

void Cord::Prepend(const Cord& src) {
  contents_.MaybeRemoveEmptyCrcNode();
  if (src.empty()) return;

  CordRep* src_tree = src.contents_.tree();
  if (src_tree != nullptr) {
    CordRep::Ref(src_tree);
    contents_.PrependTree(cord_internal::RemoveCrcNode(src_tree),
                          CordzUpdateTracker::kPrependCord);
    return;
  }

  // `src` cord is inlined.
  absl::string_view src_contents(src.contents_.data(), src.contents_.size());
  return Prepend(src_contents);
}